

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

timeval __thiscall hrgls::Message::TimeStamp(Message *this)

{
  hrgls_Status hVar1;
  Message *this_local;
  timeval ret;
  
  memset(&this_local,0,0x10);
  if (this->m_private->Message == (hrgls_Message)0x0) {
    this->m_private->status = 0x3ee;
  }
  else {
    hVar1 = hrgls_MessageGetTimeStamp(this->m_private->Message,&this_local);
    this->m_private->status = hVar1;
  }
  return _this_local;
}

Assistant:

struct timeval Message::TimeStamp() const
  {
	  struct timeval ret = {};
	  if (!m_private->Message) {
		  m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
		  return ret;
	  }
	  m_private->status = hrgls_MessageGetTimeStamp(m_private->Message, &ret);
	  return ret;
  }